

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ConstCastTestT<unsigned_char>(void)

{
  if (ConstCastTestT<unsigned_char>()::b == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::w == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::c == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::sc == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::uc == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::s == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::us == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::i == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::ui == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::l == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::ul == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::ll == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::ull == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::st == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::pt == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  if (ConstCastTestT<unsigned_char>()::pl == '\0') {
    ConstCastTestT<unsigned_char>();
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}